

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

size_t __thiscall
spirv_cross::Compiler::get_declared_struct_size_runtime_array
          (Compiler *this,SPIRType *type,size_t array_size)

{
  size_t sVar1;
  size_t type_00;
  bool bVar2;
  uint32_t uVar3;
  CompilerError *this_00;
  TypedID *this_01;
  SPIRType *pSVar4;
  bool *pbVar5;
  uint *puVar6;
  size_t sVar7;
  SPIRType *last_type;
  size_t size;
  allocator local_41;
  string local_40 [32];
  size_t local_20;
  size_t array_size_local;
  SPIRType *type_local;
  Compiler *this_local;
  
  local_20 = array_size;
  array_size_local = (size_t)type;
  type_local = (SPIRType *)this;
  bVar2 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::empty
                    (&(type->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
  if (!bVar2) {
    last_type = (SPIRType *)get_declared_struct_size(this,(SPIRType *)array_size_local);
    this_01 = (TypedID *)
              VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::back
                        ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                         (array_size_local + 0x88));
    uVar3 = TypedID::operator_cast_to_unsigned_int(this_01);
    pSVar4 = get<spirv_cross::SPIRType>(this,uVar3);
    bVar2 = VectorView<unsigned_int>::empty(&(pSVar4->array).super_VectorView<unsigned_int>);
    if (!bVar2) {
      pbVar5 = VectorView<bool>::operator[](&(pSVar4->array_size_literal).super_VectorView<bool>,0);
      if ((*pbVar5 & 1U) != 0) {
        puVar6 = VectorView<unsigned_int>::operator[]
                           (&(pSVar4->array).super_VectorView<unsigned_int>,0);
        type_00 = array_size_local;
        sVar1 = local_20;
        if (*puVar6 == 0) {
          sVar7 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                            ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                             (array_size_local + 0x88));
          uVar3 = type_struct_member_array_stride(this,(SPIRType *)type_00,(int)sVar7 - 1);
          last_type = (SPIRType *)
                      ((last_type->array).stack_storage.aligned_char + sVar1 * uVar3 + -0x38);
        }
      }
    }
    return (size_t)last_type;
  }
  this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_40,"Declared struct in block cannot be empty.",&local_41);
  CompilerError::CompilerError(this_00,(string *)local_40);
  __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
}

Assistant:

size_t Compiler::get_declared_struct_size_runtime_array(const SPIRType &type, size_t array_size) const
{
	if (type.member_types.empty())
		SPIRV_CROSS_THROW("Declared struct in block cannot be empty.");

	size_t size = get_declared_struct_size(type);
	auto &last_type = get<SPIRType>(type.member_types.back());
	if (!last_type.array.empty() && last_type.array_size_literal[0] && last_type.array[0] == 0) // Runtime array
		size += array_size * type_struct_member_array_stride(type, uint32_t(type.member_types.size() - 1));

	return size;
}